

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

int __thiscall position::see(position *this,Move *m)

{
  byte bVar1;
  Piece PVar2;
  int iVar3;
  long lVar4;
  pointer pSVar5;
  pointer pSVar6;
  bool bVar7;
  int iVar8;
  U64 UVar9;
  byte bVar10;
  Piece PVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  SeePiece *pSVar17;
  ulong uVar18;
  ulong uVar19;
  Color CVar20;
  ulong uVar21;
  SeePiece *pSVar22;
  int iStack_a8;
  SeePiece SStack_a4;
  Square SStack_9c;
  SeePiece *pSStack_98;
  ulong uStack_90;
  vector<SeePiece,_std::allocator<SeePiece>_> vStack_88;
  vector<SeePiece,_std::allocator<SeePiece>_> vStack_68;
  ulong uStack_50;
  Color CStack_44;
  Color CStack_40;
  Color CStack_3c;
  Square SStack_38;
  Square SStack_34;
  
  bVar1 = m->type;
  if (bVar1 == 0xc) {
    return 0;
  }
  if (bVar1 == 0xb) {
    if (mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [(this->pcs).piece_on._M_elems[m->f]] <=
        mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [(this->pcs).piece_on._M_elems[m->t]]) {
      return mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[(this->pcs).piece_on._M_elems[m->t]] -
             mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[(this->pcs).piece_on._M_elems[m->f]];
    }
  }
  else if ((bVar1 & 0xfc) == 4) {
    bVar10 = 4;
    if ((byte)(bVar1 - 4) < 3) {
      bVar10 = (bVar1 - 4) * -4 + 0x10;
    }
    iVar13 = *(int *)((long)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + (ulong)bVar10) -
             *mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start;
    iVar8 = iVar13 - mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(this->pcs).piece_on._M_elems[m->t]];
    if (iVar8 == 0 ||
        iVar13 < mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[(this->pcs).piece_on._M_elems[m->t]]) {
      return iVar8;
    }
  }
  SStack_34 = (this->ifo).ks[1];
  SStack_38 = (this->ifo).ks[0];
  SStack_9c = (Square)m->t;
  bVar1 = m->f;
  uVar21 = (this->pcs).bycolor._M_elems[0];
  uStack_50 = (this->pcs).bycolor._M_elems[1];
  uStack_90 = uStack_50 | uVar21;
  pSStack_98 = (SeePiece *)(uVar21 ^ (this->ifo).pinned[0]);
  uStack_50 = uStack_50 ^ (this->ifo).pinned[1];
  vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_start = (SeePiece *)0x0;
  vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SeePiece *)0x0;
  vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_start = (SeePiece *)0x0;
  vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.super__Vector_impl_data.
  _M_finish = (SeePiece *)0x0;
  PVar11 = no_piece;
LAB_00121521:
  UVar9 = attackers_of(this,&SStack_9c,&uStack_90);
  pSVar6 = vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar5 = vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar21 = UVar9 & uStack_90;
  if (uVar21 == 0) {
    if (vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_start !=
        vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar21 = (long)vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      lVar4 = 0x3f;
      if (uVar21 != 0) {
        for (; uVar21 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar5,pSVar6);
    }
    pSVar6 = vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pSVar5 = vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_start !=
        vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar21 = (long)vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      lVar4 = 0x3f;
      if (uVar21 != 0) {
        for (; uVar21 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pSVar5,pSVar6);
    }
    CVar20 = (this->ifo).stm;
    SStack_a4.p = PVar11;
    if (CVar20 == black) {
      SStack_a4.score = 0;
      std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
                (&vStack_68,
                 (const_iterator)
                 vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start,&SStack_a4);
    }
    else {
      SStack_a4.score = 0;
      std::vector<SeePiece,_std::allocator<SeePiece>_>::_M_insert_rval
                (&vStack_88,
                 (const_iterator)
                 vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start,&SStack_a4);
    }
    pSStack_98 = vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_start;
    uVar21 = (long)vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar18 = (long)vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uStack_50 = (ulong)SStack_9c;
    uVar12 = 0;
    uVar14 = 0;
    uVar15 = 0;
    iVar13 = 0;
    do {
      if (uVar12 == 0) {
        PVar11 = (this->pcs).piece_on._M_elems[uStack_50];
        iVar8 = 0;
        uVar12 = 1;
        if ((ulong)PVar11 != 7) {
          iStack_a8 = 0;
          if (PVar11 == king) goto LAB_001218a8;
          iVar8 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[PVar11];
        }
      }
      else {
        uVar16 = (ulong)uVar14;
        iStack_a8 = iVar13;
        if ((uVar21 <= uVar16) || (uVar19 = (ulong)uVar15, uVar18 <= uVar19)) goto LAB_001218a8;
        if (CVar20 == white) {
          pSVar22 = vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar19;
          uVar15 = uVar15 + 1;
          pSVar17 = vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar16;
        }
        else {
          if (CVar20 != black) goto LAB_001218a8;
          pSVar22 = vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar16;
          uVar14 = uVar14 + 1;
          pSVar17 = vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar19;
        }
        PVar11 = pSVar17->p;
        if ((ulong)PVar11 == 7) goto LAB_001218a8;
        PVar2 = pSVar22->p;
        iVar3 = mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[PVar2];
        if (iVar3 < mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[PVar11] || (ulong)PVar2 == 5) {
          uVar16 = uVar18;
          uVar19 = uVar21;
          if (PVar11 == king) {
            if (CVar20 == white) {
              if (uVar15 < uVar18) goto LAB_001218a8;
              if (PVar2 == king) goto LAB_0012187c;
              goto joined_r0x00121889;
            }
            if (uVar14 < uVar21) goto LAB_001218a8;
            if (PVar2 == king) goto LAB_00121858;
          }
          else if (PVar2 == king) {
            if (CVar20 != white) {
LAB_00121858:
              uVar19 = (ulong)uVar15;
joined_r0x00121889:
              if (uVar19 < uVar18) goto LAB_001218a8;
              goto LAB_0012188b;
            }
LAB_0012187c:
            uVar16 = (ulong)uVar14;
          }
          else if (CVar20 == white) goto joined_r0x00121889;
          if (uVar16 < uVar21) {
LAB_001218a8:
            if (vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start != (SeePiece *)0x0) {
              operator_delete(vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)vStack_88.
                                    super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)vStack_88.
                                    super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                super__Vector_impl_data._M_start != (SeePiece *)0x0) {
              operator_delete(vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)vStack_68.
                                    super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)vStack_68.
                                    super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            return iStack_a8;
          }
        }
LAB_0012188b:
        iVar8 = -iVar3;
        if ((uVar12 & 1) == 0) {
          iVar8 = iVar3;
        }
        uVar12 = uVar12 + 1;
      }
      iVar13 = iVar13 + iVar8;
      CVar20 = CVar20 ^ black;
    } while( true );
  }
  uStack_90 = uStack_90 ^ uVar21;
  SStack_a4.p = pawn;
  CStack_3c = black;
  bVar7 = is_attacked(this,&SStack_38,&SStack_a4.p,&CStack_3c,uStack_90);
  if (bVar7) {
    iStack_a8 = 0;
    goto LAB_001218a8;
  }
  CStack_40 = black;
  CStack_44 = white;
  bVar7 = is_attacked(this,&SStack_34,&CStack_40,&CStack_44,uStack_90);
  iStack_a8 = 0;
  if (bVar7) goto LAB_001218a8;
  for (uVar18 = uVar21 & (ulong)pSStack_98; uVar18 != 0; uVar18 = uVar18 & uVar18 - 1) {
    lVar4 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
      }
    }
    if ((uint)lVar4 == (uint)bVar1) {
      PVar11 = (this->pcs).piece_on._M_elems[lVar4];
    }
    else {
      SStack_a4.p = (this->pcs).piece_on._M_elems[lVar4];
      SStack_a4.score =
           (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[SStack_a4.p];
      std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                (&vStack_88,&SStack_a4);
    }
  }
  uVar21 = uVar21 & uStack_50;
  if (uVar21 != 0) {
    do {
      lVar4 = 0;
      if (uVar21 != 0) {
        for (; (uVar21 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
        }
      }
      if ((uint)lVar4 == (uint)bVar1) {
        PVar11 = (this->pcs).piece_on._M_elems[lVar4];
      }
      else {
        SStack_a4.p = (this->pcs).piece_on._M_elems[lVar4];
        SStack_a4.score =
             (int16)mvals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[SStack_a4.p];
        std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                  (&vStack_68,&SStack_a4);
      }
      uVar21 = uVar21 & uVar21 - 1;
    } while (uVar21 != 0);
  }
  if (((vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_88.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
        super__Vector_impl_data._M_start) ||
      (vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       vStack_68.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
       super__Vector_impl_data._M_start)) || (PVar11 != no_piece)) goto LAB_00121521;
  goto LAB_001218a8;
}

Assistant:

int position::see(const Move& m) const {

	if (m.type == Movetype::ep) return 0;

	else if (m.type == Movetype::capture &&
		(mvals[piece_on(Square(m.f))] <= mvals[piece_on(Square(m.t))])) {
		return (mvals[piece_on(Square(m.t))] - mvals[piece_on(Square(m.f))]);
	}

	else if (m.type == Movetype::capture_promotion_q ||
		m.type == Movetype::capture_promotion_r ||
		m.type == Movetype::capture_promotion_b ||
		m.type == Movetype::capture_promotion_n) {
		int fval = (m.type == Movetype::capture_promotion_q ? mvals[queen] :
			m.type == Movetype::capture_promotion_r ? mvals[rook] :
			m.type == Movetype::capture_promotion_b ? mvals[bishop] :
			mvals[knight]) - mvals[0];
		int tval = mvals[piece_on(Square(m.t))];

		if (fval <= tval) return fval - tval;
	}


	return see_move(m);
}